

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = true;
  if (aff == 'b') goto LAB_0016c481;
  while (bVar2 = p->op, bVar2 - 0x9c < 2) {
    p = p->pLeft;
  }
  if (bVar2 == 0x84) {
    bVar2 = p->op2;
  }
  if (bVar2 < 0x82) {
    if (bVar2 == 0x5e) {
      bVar1 = aff == 'a';
      goto LAB_0016c481;
    }
    if (bVar2 == 0x81) {
      bVar1 = (byte)(aff + 0x9dU) < 2;
      goto LAB_0016c481;
    }
  }
  else {
    if (bVar2 == 0x82) {
      bVar1 = (aff + 0x9dU & 0xfd) == 0;
      goto LAB_0016c481;
    }
    if (bVar2 == 0x83) goto LAB_0016c481;
    if (bVar2 == 0x98) {
      bVar1 = (byte)(aff + 0x9dU) < 2 && p->iColumn < 0;
      goto LAB_0016c481;
    }
  }
  bVar1 = false;
LAB_0016c481:
  return (int)bVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  if( aff==SQLITE_AFF_NONE ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){ p = p->pLeft; }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff==SQLITE_AFF_INTEGER || aff==SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff==SQLITE_AFF_REAL || aff==SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return 1;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return p->iColumn<0
          && (aff==SQLITE_AFF_INTEGER || aff==SQLITE_AFF_NUMERIC);
    }
    default: {
      return 0;
    }
  }
}